

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpolants.cpp
# Opt level: O3

SubproofsUnionFind * __thiscall
Shell::Interpolants::computeSubproofs
          (SubproofsUnionFind *__return_storage_ptr__,Interpolants *this,Unit *refutation,
          SplittingFunction *splittingFunction)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  const_iterator cVar4;
  Unit *unit2;
  VirtualIterator<Kernel::Unit_*> parents;
  Unit *current;
  unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
  unitsToSize;
  ProofIteratorBFSPreOrder it;
  long *local_148;
  Unit *local_140;
  _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_Kernel::Color>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Color>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_138;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Unit_*const,_int>,_false>_>_>
  local_130;
  _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_128;
  _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  ProofIteratorBFSPreOrder local_b8;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_f0._M_buckets = &local_f0._M_single_bucket;
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  local_138 = &splittingFunction->_M_h;
  ProofIteratorBFSPreOrder::ProofIteratorBFSPreOrder(&local_b8,refutation);
  while( true ) {
    bVar2 = ProofIteratorBFSPreOrder::hasNext(&local_b8);
    if (!bVar2) {
      std::
      _Hashtable<Kernel::Unit_*,_Kernel::Unit_*,_std::allocator<Kernel::Unit_*>,_std::__detail::_Identity,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_b8.visited._M_h);
      std::_Deque_base<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>::~_Deque_base
                ((_Deque_base<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> *)&local_b8);
      std::
      _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_f0);
      return __return_storage_ptr__;
    }
    local_140 = ProofIteratorBFSPreOrder::next(&local_b8);
    cVar4 = std::
            _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_Kernel::Color>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Color>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_138,&local_140);
    if (cVar4.super__Node_iterator_base<std::pair<Kernel::Unit_*const,_Kernel::Color>,_false>._M_cur
        == (__node_type *)0x0) break;
    if (*(int *)((long)cVar4.
                       super__Node_iterator_base<std::pair<Kernel::Unit_*const,_Kernel::Color>,_false>
                       ._M_cur + 0x10) == 1) {
      Kernel::Unit::getParents((Unit *)&local_148);
      while( true ) {
        cVar3 = (**(code **)(*local_148 + 0x10))();
        if (cVar3 == '\0') break;
        unit2 = (Unit *)(**(code **)(*local_148 + 0x18))();
        local_128._M_buckets = (__buckets_ptr)0x0;
        local_128._M_bucket_count = local_f0._M_bucket_count;
        local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_128._M_element_count = local_f0._M_element_count;
        local_128._M_rehash_policy._4_4_ = local_f0._M_rehash_policy._4_4_;
        local_128._M_rehash_policy._M_max_load_factor = local_f0._M_rehash_policy._M_max_load_factor
        ;
        local_128._M_rehash_policy._M_next_resize = local_f0._M_rehash_policy._M_next_resize;
        local_128._M_single_bucket = (__node_base_ptr)0x0;
        local_130._M_h = (__hashtable_alloc *)&local_128;
        std::
        _Hashtable<Kernel::Unit*,std::pair<Kernel::Unit*const,int>,std::allocator<std::pair<Kernel::Unit*const,int>>,std::__detail::_Select1st,std::equal_to<Kernel::Unit*>,std::hash<Kernel::Unit*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign<std::_Hashtable<Kernel::Unit*,std::pair<Kernel::Unit*const,int>,std::allocator<std::pair<Kernel::Unit*const,int>>,std::__detail::_Select1st,std::equal_to<Kernel::Unit*>,std::hash<Kernel::Unit*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Unit*const,int>,false>>>>
                  ((_Hashtable<Kernel::Unit*,std::pair<Kernel::Unit*const,int>,std::allocator<std::pair<Kernel::Unit*const,int>>,std::__detail::_Select1st,std::equal_to<Kernel::Unit*>,std::hash<Kernel::Unit*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_128,&local_f0,&local_130);
        merge(this,__return_storage_ptr__,
              (unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
               *)&local_128,local_140,unit2);
        std::
        _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_128);
      }
      if (local_148 != (long *)0x0) {
        plVar1 = local_148 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        if ((int)*plVar1 == 0) {
          (**(code **)(*local_148 + 8))();
        }
      }
    }
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

Interpolants::SubproofsUnionFind Interpolants::computeSubproofs(Unit* refutation, const SplittingFunction& splittingFunction)
    {
        std::unordered_map<Unit*, Unit*> unitsToRepresentative; // maps each unit u1 (belonging to a red subproof) to the representative unit u2 of that subproof
        std::unordered_map<Unit*, int> unitsToSize; // needed for weighted quick-union: for each unit, counts number of elements rooted in that unit

        ProofIteratorBFSPreOrder it(refutation); // traverse the proof in breadth-first pre-order
        while (it.hasNext())
        {
            Unit* current = it.next();

            // standard union-find: if current inference is assigned to A-part of the proof,
            if (splittingFunction.at(current) == COLOR_LEFT)
            {
                // then for each parent inference,
                VirtualIterator<Unit*> parents = current->getParents();
                while (parents.hasNext())
                {
                    Unit* premise = parents.next();

                    // the parent may be from the B-part, this is to induce connectedness over a common parent
                    // (Even then we want to merge, so that this parent appears only once in the final interpolant.)
                    {
                        // merge the subproof of the current inference with the subproof of the parent inference
                        merge(unitsToRepresentative, unitsToSize, current, premise);
                    }
                }
            }
        }

        return unitsToRepresentative;
    }